

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::process_deferred_queue
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  lock_guard<std::mutex> local_50;
  lock_guard lock_1;
  event_process_result res;
  lock_guard<std::mutex> local_38;
  lock_guard lock;
  event_queue deferred;
  priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *this_local;
  
  std::
  priority_queue<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
  ::
  priority_queue<std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,void>
            ((priority_queue<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
              *)&lock);
  std::lock_guard<std::mutex>::lock_guard(&local_38,&this->deferred_mutex_);
  std::
  swap<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
            (&this->deferred_events_,
             (priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
              *)&lock);
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  do {
    bVar1 = std::
            priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
            ::empty((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                     *)&lock);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
      ::~priority_queue((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                         *)&lock);
      return;
    }
    sVar2 = std::
            priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
            ::size((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                    *)&lock);
    detail::observer_wrapper<afsm::test::test_fsm_observer>::
    start_process_deferred_queue<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
              (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,sVar2);
    lock_1._M_device._0_4_ = refuse;
    do {
      bVar1 = std::
              priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
              ::empty((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                       *)&lock);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pvVar3 = std::
               priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
               ::top((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                      *)&lock);
      lock_1._M_device._0_4_ =
           std::function<afsm::actions::event_process_result_()>::operator()(&pvVar3->first);
      std::
      priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
      ::pop((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
             *)&lock);
    } while ((event_process_result)lock_1._M_device != process);
    std::lock_guard<std::mutex>::lock_guard(&local_50,&this->deferred_mutex_);
    while (bVar1 = std::
                   priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                   ::empty((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                            *)&lock), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::
               priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
               ::top((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                      *)&lock);
      std::
      priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
      ::push(&this->deferred_events_,pvVar3);
      std::
      priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
      ::pop((priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
             *)&lock);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_50);
    sVar2 = std::
            priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
            ::size(&this->deferred_events_);
    detail::observer_wrapper<afsm::test::test_fsm_observer>::
    end_process_deferred_queue<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
              (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,sVar2);
    if ((event_process_result)lock_1._M_device == process) {
      std::
      swap<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
                (&this->deferred_events_,
                 (priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
                  *)&lock);
    }
  } while( true );
}

Assistant:

void
    process_deferred_queue()
    {
        using actions::event_process_result;
        event_queue deferred;
        {
            lock_guard lock{deferred_mutex_};
            ::std::swap(deferred_events_, deferred);
        }
        while (!deferred.empty()) {
            observer_wrapper::start_process_deferred_queue(*this, deferred.size());
            auto res = event_process_result::refuse;
            while (!deferred.empty()) {
                res = deferred.top().first();
                deferred.pop();
                if (res == event_process_result::process)
                    break;
            }
            {
                lock_guard lock{deferred_mutex_};
                while (!deferred.empty()) {
                    deferred_events_.push(deferred.top());
                    deferred.pop();
                }
            }
            observer_wrapper::end_process_deferred_queue(*this, deferred_events_.size());
            if (res == event_process_result::process) {
                ::std::swap(deferred_events_, deferred);
            }
        }
    }